

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_posix.h
# Opt level: O0

void snmalloc::PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::error(char *str)

{
  char *in_RDI;
  iovec iov [3];
  void *nl;
  int local_64;
  ssize_t local_60;
  iovec local_58;
  size_t local_40;
  char *local_38;
  undefined8 local_30;
  char *local_20;
  ssize_t *local_10;
  int *local_8;
  
  local_20 = "\n";
  local_58.iov_base = "\n";
  local_58.iov_len = 1;
  local_40 = strlen(in_RDI);
  local_38 = local_20;
  local_30 = 1;
  local_60 = writev(2,&local_58,3);
  local_10 = &local_60;
  local_64 = fsync(2);
  local_8 = &local_64;
  print_stack_trace();
  abort();
}

Assistant:

[[noreturn]] static void error(const char* const str) noexcept
    {
      /// by this part, the allocator is failed; so we cannot assume
      /// subsequent allocation will work.
      /// @attention: since the program is failing, we do not guarantee that
      /// previous bytes in stdout will be flushed
      void* nl = const_cast<char*>("\n");
      struct iovec iov[] = {
        {nl, 1}, {const_cast<char*>(str), strlen(str)}, {nl, 1}};
      UNUSED(writev(STDERR_FILENO, iov, sizeof(iov) / sizeof(struct iovec)));
      UNUSED(fsync(STDERR_FILENO));
      print_stack_trace();
      abort();
    }